

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.hpp
# Opt level: O0

ConstStridedValueAccess<64> __thiscall
rsg::ConstStridedValueAccess<64>::member(ConstStridedValueAccess<64> *this,int memberNdx)

{
  Scalar *pSVar1;
  int iVar2;
  VariableType *pVVar3;
  vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_> *this_00;
  const_reference this_01;
  VariableType *this_02;
  int memberNdx_local;
  ConstStridedValueAccess<64> *this_local;
  
  pVVar3 = getType(this);
  this_00 = VariableType::getMembers(pVVar3);
  this_01 = std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>::
            operator[](this_00,(long)memberNdx);
  pVVar3 = VariableType::Member::getType(this_01);
  pSVar1 = this->m_value;
  this_02 = getType(this);
  iVar2 = VariableType::getMemberScalarOffset(this_02,memberNdx);
  ConstStridedValueAccess((ConstStridedValueAccess<64> *)&this_local,pVVar3,pSVar1 + (iVar2 << 6));
  return _this_local;
}

Assistant:

ConstStridedValueAccess		member					(int memberNdx) const	{ return ConstStridedValueAccess(getType().getMembers()[memberNdx].getType(), m_value + Stride*getType().getMemberScalarOffset(memberNdx));	}